

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_error(HSQUIRRELVM v)

{
  SQRESULT SVar1;
  SQInteger in_RDI;
  SQChar *str;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQChar **in_stack_ffffffffffffffe8;
  HSQUIRRELVM in_stack_fffffffffffffff8;
  SQInteger SVar2;
  
  SVar1 = sq_tostring(in_stack_00000028,in_stack_00000020);
  if ((SVar1 < 0) ||
     (SVar1 = sq_getstring(in_stack_fffffffffffffff8,in_RDI,in_stack_ffffffffffffffe8), SVar1 < 0))
  {
    SVar2 = -1;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0x118) + 0x150) != 0) {
      (**(code **)(*(long *)(in_RDI + 0x118) + 0x150))(in_RDI,"%s",in_stack_ffffffffffffffe8);
    }
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

static SQInteger base_error(HSQUIRRELVM v)
{
    const SQChar *str;
    if(SQ_SUCCEEDED(sq_tostring(v,2)))
    {
        if(SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
            if(_ss(v)->_errorfunc) _ss(v)->_errorfunc(v,_SC("%s"),str);
            return 0;
        }
    }
    return SQ_ERROR;
}